

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HyperLogLogTest.cpp
# Opt level: O0

bool __thiscall TrailingZeroes_test::DoTest(TrailingZeroes_test *this)

{
  uint uVar1;
  uint64_t fnv64;
  int zv;
  uint64_t tz;
  int z;
  uint8_t mask;
  uint64_t t64;
  uint64_t i;
  TrailingZeroes_test *pTStack_10;
  bool ret;
  TrailingZeroes_test *this_local;
  
  i._7_1_ = 1;
  pTStack_10 = this;
  for (t64 = 0; (i._7_1_ & 1) != 0 && t64 < 0x100; t64 = t64 + 2) {
    memset(&z,(uint)(byte)((char)t64 + 1),8);
    _z = _z | 1;
    for (tz._0_4_ = 0; (i._7_1_ & 1) != 0 && (int)(uint)tz < 0x20; tz._0_4_ = (uint)tz + 1) {
      fnv64 = _z << ((byte)(uint)tz & 0x3f);
      uVar1 = HyperLogLog::TrailingZeroes(fnv64);
      if (uVar1 != (uint)tz) {
        TEST_LOG("NbZeroes(0x%lx) = %d instead of %d\n",fnv64,(ulong)uVar1,(ulong)(uint)tz);
        i._7_1_ = 0;
      }
    }
  }
  return (bool)(i._7_1_ & 1);
}

Assistant:

bool TrailingZeroes_test::DoTest()
{
    bool ret = true;

    for (uint64_t i = 0; ret && i < 256; i += 2) {
        uint64_t t64;
        uint8_t mask = (uint8_t)((i + 1) & 0xff);
        memset(&t64, mask, sizeof(t64));
        t64 |= 1;
        for (int z = 0; ret && z < 32; z++) {
            uint64_t tz = (t64 << z);
            int zv = HyperLogLog::TrailingZeroes(tz);

            if (zv != z) {
                TEST_LOG("NbZeroes(0x%" PRIx64 ") = %d instead of %d\n",
                    tz, zv, z);
                ret = false;
            }
        }
    }
    return ret;
}